

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O2

void __thiscall fasttext::DenseMatrix::load(DenseMatrix *this,istream *in)

{
  AlignedVector<float> local_28;
  
  std::istream::read((char *)in,(long)&(this->super_Matrix).m_);
  std::istream::read((char *)in,(long)&(this->super_Matrix).n_);
  intgemm::AlignedVector<float>::AlignedVector
            (&local_28,(this->super_Matrix).n_ * (this->super_Matrix).m_,0x40);
  intgemm::AlignedVector<float>::operator=(&this->data_,&local_28);
  free(local_28.mem_);
  std::istream::read((char *)in,(long)(this->data_).mem_);
  return;
}

Assistant:

void DenseMatrix::load(std::istream& in) {
  in.read((char*)&m_, sizeof(int64_t));
  in.read((char*)&n_, sizeof(int64_t));
  data_ = intgemm::AlignedVector<real>(m_ * n_);
  in.read((char*)data_.data(), m_ * n_ * sizeof(real));
}